

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *pVal;
  uint uVar1;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  int n;
  long lVar8;
  char *pcVar9;
  code *xDel;
  double dVar10;
  double r2;
  char zBuf [50];
  double local_70;
  char local_68 [64];
  
  pVal = *argv;
  switch("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
         [pVal->flags & 0x1f]) {
  case '\x01':
    sqlite3VdbeMemCopy(context->pOut,pVal);
    return;
  case '\x02':
    dVar10 = sqlite3VdbeRealValue(pVal);
    sqlite3_snprintf(0x32,local_68,"%!.15g");
    sqlite3AtoF(local_68,&local_70,0x14,'\x01');
    if ((dVar10 != local_70) || (NAN(dVar10) || NAN(local_70))) {
      sqlite3_snprintf(0x32,local_68,"%!.20e");
    }
    setResultStrOrError(context,local_68,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    return;
  case '\x03':
    pcVar2 = (char *)sqlite3ValueText(pVal,'\x01');
    if (pcVar2 == (char *)0x0) {
      return;
    }
    lVar3 = 3;
    lVar8 = 0;
    do {
      if (pcVar2[lVar3 + -3] == '\'') {
        lVar8 = lVar8 + 1;
      }
      else if (pcVar2[lVar3 + -3] == '\0') goto LAB_0018ebc3;
      lVar3 = lVar3 + 1;
    } while( true );
  case '\x04':
    pvVar4 = sqlite3_value_blob(pVal);
    uVar1 = sqlite3ValueBytes(*argv,'\x01');
    pcVar9 = (char *)contextMalloc(context,(long)(int)uVar1 * 2 + 4);
    if (pcVar9 == (char *)0x0) {
      return;
    }
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        pcVar9[uVar6 * 2 + 2] = "0123456789ABCDEF"[*(byte *)((long)pvVar4 + uVar6) >> 4];
        pcVar9[uVar6 * 2 + 3] = "0123456789ABCDEF"[*(byte *)((long)pvVar4 + uVar6) & 0xf];
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    (pcVar9 + (long)(int)uVar1 * 2 + 2)[0] = '\'';
    (pcVar9 + (long)(int)uVar1 * 2 + 2)[1] = '\0';
    pcVar9[0] = 'X';
    pcVar9[1] = '\'';
    setResultStrOrError(context,pcVar9,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(pcVar9);
    return;
  default:
    pcVar9 = "NULL";
    n = 4;
    xDel = (_func_void_void_ptr *)0x0;
  }
LAB_0018ec2f:
  setResultStrOrError(context,pcVar9,n,'\x01',xDel);
  return;
LAB_0018ebc3:
  pcVar9 = (char *)contextMalloc(context,lVar8 + lVar3);
  if (pcVar9 == (char *)0x0) {
    return;
  }
  *pcVar9 = '\'';
  cVar7 = *pcVar2;
  if (cVar7 == '\0') {
    iVar5 = 1;
  }
  else {
    iVar5 = 1;
    do {
      pcVar9[iVar5] = cVar7;
      uVar6 = (long)iVar5 + 1;
      if (*pcVar2 == '\'') {
        pcVar9[uVar6] = '\'';
        uVar6 = (ulong)(iVar5 + 2);
      }
      cVar7 = pcVar2[1];
      iVar5 = (int)uVar6;
      pcVar2 = pcVar2 + 1;
    } while (cVar7 != '\0');
  }
  n = iVar5 + 1;
  (pcVar9 + iVar5)[0] = '\'';
  (pcVar9 + iVar5)[1] = '\0';
  xDel = sqlite3_free;
  goto LAB_0018ec2f;
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_FLOAT: {
      double r1, r2;
      char zBuf[50];
      r1 = sqlite3_value_double(argv[0]);
      sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.15g", r1);
      sqlite3AtoF(zBuf, &r2, 20, SQLITE_UTF8);
      if( r1!=r2 ){
        sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.20e", r1);
      }
      sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
      break;
    }
    case SQLITE_INTEGER: {
      sqlite3_result_value(context, argv[0]);
      break;
    }
    case SQLITE_BLOB: {
      char *zText = 0;
      char const *zBlob = sqlite3_value_blob(argv[0]);
      int nBlob = sqlite3_value_bytes(argv[0]);
      assert( zBlob==sqlite3_value_blob(argv[0]) ); /* No encoding change */
      zText = (char *)contextMalloc(context, (2*(i64)nBlob)+4); 
      if( zText ){
        int i;
        for(i=0; i<nBlob; i++){
          zText[(i*2)+2] = hexdigits[(zBlob[i]>>4)&0x0F];
          zText[(i*2)+3] = hexdigits[(zBlob[i])&0x0F];
        }
        zText[(nBlob*2)+2] = '\'';
        zText[(nBlob*2)+3] = '\0';
        zText[0] = 'X';
        zText[1] = '\'';
        sqlite3_result_text(context, zText, -1, SQLITE_TRANSIENT);
        sqlite3_free(zText);
      }
      break;
    }
    case SQLITE_TEXT: {
      int i,j;
      u64 n;
      const unsigned char *zArg = sqlite3_value_text(argv[0]);
      char *z;

      if( zArg==0 ) return;
      for(i=0, n=0; zArg[i]; i++){ if( zArg[i]=='\'' ) n++; }
      z = contextMalloc(context, ((i64)i)+((i64)n)+3);
      if( z ){
        z[0] = '\'';
        for(i=0, j=1; zArg[i]; i++){
          z[j++] = zArg[i];
          if( zArg[i]=='\'' ){
            z[j++] = '\'';
          }
        }
        z[j++] = '\'';
        z[j] = 0;
        sqlite3_result_text(context, z, j, sqlite3_free);
      }
      break;
    }
    default: {
      assert( sqlite3_value_type(argv[0])==SQLITE_NULL );
      sqlite3_result_text(context, "NULL", 4, SQLITE_STATIC);
      break;
    }
  }
}